

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_psbt.cpp
# Opt level: O3

bool __thiscall cfd::Psbt::IsFindTxIn(Psbt *this,OutPoint *outpoint,uint32_t *index)

{
  uint32_t uVar1;
  string errmsg;
  Txid local_40;
  
  core::OutPoint::GetTxid(&local_40,outpoint);
  uVar1 = core::OutPoint::GetVout(outpoint);
  uVar1 = core::Transaction::GetTxInIndex(&(this->super_Psbt).base_tx_,&local_40,uVar1);
  local_40._vptr_Txid = (_func_int **)&PTR__Txid_0086d9f8;
  if (local_40.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
      .super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_40.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_40.data_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_40.data_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (index != (uint32_t *)0x0) {
    *index = uVar1;
  }
  return true;
}

Assistant:

bool Psbt::IsFindTxIn(const OutPoint& outpoint, uint32_t* index) const {
  static constexpr const char* const kErrorMessage = "Txid is not found.";
  try {
    uint32_t temp_index =
        base_tx_.GetTxInIndex(outpoint.GetTxid(), outpoint.GetVout());
    if (index != nullptr) *index = temp_index;
    return true;
  } catch (const CfdException& except) {
    std::string errmsg(except.what());
    if (errmsg == kErrorMessage) {
      return false;
    } else {
      throw except;
    }
  }
}